

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O2

void __thiscall
CDirectiveConditional::CDirectiveConditional
          (CDirectiveConditional *this,ConditionType type,Identifier *name)

{
  Identifier *args;
  undefined1 local_20 [16];
  
  CDirectiveConditional(this,type);
  args = (Identifier *)(ulong)(uint)Global.FileInfo.FileNum;
  SymbolTable::getLabel
            ((SymbolTable *)local_20,(Identifier *)&Global.symbolTable,(int)name,
             Global.FileInfo.FileNum);
  std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
  if ((this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    Logger::printError<Identifier>((Logger *)0x1,0x1751cd,(char *)name,args);
  }
  return;
}

Assistant:

CDirectiveConditional::CDirectiveConditional(ConditionType type, const Identifier& name)
	: CDirectiveConditional(type)
{
	label = Global.symbolTable.getLabel(name,Global.FileInfo.FileNum,Global.Section);
	if (label == nullptr)
		Logger::printError(Logger::Error, "Invalid label name \"%s\"",name);
}